

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatDatatypeValidator.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::FloatDatatypeValidator::serialize
          (FloatDatatypeValidator *this,XSerializeEngine *serEng)

{
  if (serEng->fStoreLoad == 0) {
    XSerializeEngine::operator<<(serEng,0);
  }
  AbstractNumericValidator::serialize(&this->super_AbstractNumericValidator,serEng);
  return;
}

Assistant:

void FloatDatatypeValidator::serialize(XSerializeEngine& serEng)
{
    /***
     * Note: 
     *
     *     During storing, we need write the specific number
     *     type info before calling base::serialize().
     *
     *     While loading, we do nothing here
     ***/

    if (serEng.isStoring())
    {
        serEng<<(int) (XMLNumber::Float);
    }

    AbstractNumericValidator::serialize(serEng);

}